

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  ulong *puVar30;
  ulong uVar31;
  byte bVar32;
  ulong unaff_RBP;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  size_t *psVar39;
  bool bVar40;
  float fVar41;
  uint uVar42;
  float fVar43;
  float fVar44;
  uint uVar45;
  float fVar46;
  float fVar47;
  uint uVar48;
  float fVar49;
  vint4 bi;
  float fVar50;
  uint uVar51;
  float fVar52;
  float fVar53;
  uint uVar54;
  uint uVar55;
  float fVar56;
  float fVar57;
  uint uVar58;
  uint uVar59;
  float fVar60;
  float fVar61;
  uint uVar62;
  uint uVar63;
  float fVar64;
  vint4 ai;
  float fVar65;
  uint uVar66;
  uint uVar67;
  float fVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  vint4 ai_1;
  uint uVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  NodeRef stack [244];
  byte local_8e8;
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar30 = local_7d0;
  local_7d8 = root.ptr;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar8 = (tray->tnear).field_0.i[k];
  iVar9 = (tray->tfar).field_0.i[k];
  bVar40 = true;
  do {
    psVar39 = &local_7d8;
    uVar38 = puVar30[-1];
    puVar30 = puVar30 + -1;
    while ((uVar38 & 8) == 0) {
      pfVar1 = (float *)(uVar38 + 0x20 + uVar31);
      fVar41 = (*pfVar1 - fVar2) * fVar5;
      fVar44 = (pfVar1[1] - fVar2) * fVar5;
      fVar47 = (pfVar1[2] - fVar2) * fVar5;
      fVar50 = (pfVar1[3] - fVar2) * fVar5;
      pfVar1 = (float *)(uVar38 + 0x20 + uVar36);
      fVar53 = (*pfVar1 - fVar3) * fVar6;
      fVar57 = (pfVar1[1] - fVar3) * fVar6;
      fVar61 = (pfVar1[2] - fVar3) * fVar6;
      fVar65 = (pfVar1[3] - fVar3) * fVar6;
      uVar54 = (uint)((int)fVar53 < (int)fVar41) * (int)fVar41 |
               (uint)((int)fVar53 >= (int)fVar41) * (int)fVar53;
      uVar58 = (uint)((int)fVar57 < (int)fVar44) * (int)fVar44 |
               (uint)((int)fVar57 >= (int)fVar44) * (int)fVar57;
      uVar62 = (uint)((int)fVar61 < (int)fVar47) * (int)fVar47 |
               (uint)((int)fVar61 >= (int)fVar47) * (int)fVar61;
      uVar66 = (uint)((int)fVar65 < (int)fVar50) * (int)fVar50 |
               (uint)((int)fVar65 >= (int)fVar50) * (int)fVar65;
      pfVar1 = (float *)(uVar38 + 0x20 + uVar37);
      fVar41 = (*pfVar1 - fVar4) * fVar7;
      fVar44 = (pfVar1[1] - fVar4) * fVar7;
      fVar47 = (pfVar1[2] - fVar4) * fVar7;
      fVar50 = (pfVar1[3] - fVar4) * fVar7;
      uVar42 = (uint)((int)fVar41 < iVar8) * iVar8 | (uint)((int)fVar41 >= iVar8) * (int)fVar41;
      uVar45 = (uint)((int)fVar44 < iVar8) * iVar8 | (uint)((int)fVar44 >= iVar8) * (int)fVar44;
      uVar48 = (uint)((int)fVar47 < iVar8) * iVar8 | (uint)((int)fVar47 >= iVar8) * (int)fVar47;
      uVar51 = (uint)((int)fVar50 < iVar8) * iVar8 | (uint)((int)fVar50 >= iVar8) * (int)fVar50;
      pfVar1 = (float *)(uVar38 + 0x20 + (uVar31 ^ 0x10));
      fVar41 = (*pfVar1 - fVar2) * fVar5;
      fVar44 = (pfVar1[1] - fVar2) * fVar5;
      fVar47 = (pfVar1[2] - fVar2) * fVar5;
      fVar50 = (pfVar1[3] - fVar2) * fVar5;
      pfVar1 = (float *)(uVar38 + 0x20 + (uVar36 ^ 0x10));
      fVar53 = (*pfVar1 - fVar3) * fVar6;
      fVar57 = (pfVar1[1] - fVar3) * fVar6;
      fVar61 = (pfVar1[2] - fVar3) * fVar6;
      fVar65 = (pfVar1[3] - fVar3) * fVar6;
      uVar69 = (uint)((int)fVar41 < (int)fVar53) * (int)fVar41 |
               (uint)((int)fVar41 >= (int)fVar53) * (int)fVar53;
      uVar70 = (uint)((int)fVar44 < (int)fVar57) * (int)fVar44 |
               (uint)((int)fVar44 >= (int)fVar57) * (int)fVar57;
      uVar71 = (uint)((int)fVar47 < (int)fVar61) * (int)fVar47 |
               (uint)((int)fVar47 >= (int)fVar61) * (int)fVar61;
      uVar72 = (uint)((int)fVar50 < (int)fVar65) * (int)fVar50 |
               (uint)((int)fVar50 >= (int)fVar65) * (int)fVar65;
      pfVar1 = (float *)(uVar38 + 0x20 + (uVar37 ^ 0x10));
      fVar41 = (*pfVar1 - fVar4) * fVar7;
      fVar44 = (pfVar1[1] - fVar4) * fVar7;
      fVar47 = (pfVar1[2] - fVar4) * fVar7;
      fVar50 = (pfVar1[3] - fVar4) * fVar7;
      uVar55 = (uint)(iVar9 < (int)fVar41) * iVar9 | (uint)(iVar9 >= (int)fVar41) * (int)fVar41;
      uVar59 = (uint)(iVar9 < (int)fVar44) * iVar9 | (uint)(iVar9 >= (int)fVar44) * (int)fVar44;
      uVar63 = (uint)(iVar9 < (int)fVar47) * iVar9 | (uint)(iVar9 >= (int)fVar47) * (int)fVar47;
      uVar67 = (uint)(iVar9 < (int)fVar50) * iVar9 | (uint)(iVar9 >= (int)fVar50) * (int)fVar50;
      auVar11._4_4_ =
           -(uint)((int)(((int)uVar70 < (int)uVar59) * uVar70 |
                        ((int)uVar70 >= (int)uVar59) * uVar59) <
                  (int)(((int)uVar45 < (int)uVar58) * uVar58 | ((int)uVar45 >= (int)uVar58) * uVar45
                       ));
      auVar11._0_4_ =
           -(uint)((int)(((int)uVar69 < (int)uVar55) * uVar69 |
                        ((int)uVar69 >= (int)uVar55) * uVar55) <
                  (int)(((int)uVar42 < (int)uVar54) * uVar54 | ((int)uVar42 >= (int)uVar54) * uVar42
                       ));
      auVar11._8_4_ =
           -(uint)((int)(((int)uVar71 < (int)uVar63) * uVar71 |
                        ((int)uVar71 >= (int)uVar63) * uVar63) <
                  (int)(((int)uVar48 < (int)uVar62) * uVar62 | ((int)uVar48 >= (int)uVar62) * uVar48
                       ));
      auVar11._12_4_ =
           -(uint)((int)(((int)uVar72 < (int)uVar67) * uVar72 |
                        ((int)uVar72 >= (int)uVar67) * uVar67) <
                  (int)(((int)uVar51 < (int)uVar66) * uVar66 | ((int)uVar51 >= (int)uVar66) * uVar51
                       ));
      uVar42 = movmskps((int)unaff_RBP,auVar11);
      unaff_RBP = (ulong)uVar42;
      if (uVar42 == 0xf) goto LAB_0024f556;
      bVar32 = (byte)uVar42 ^ 0xf;
      uVar33 = uVar38 & 0xfffffffffffffff0;
      lVar34 = 0;
      if (bVar32 != 0) {
        for (; (bVar32 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
        }
      }
      uVar38 = *(ulong *)(uVar33 + lVar34 * 8);
      uVar42 = bVar32 - 1 & (uint)bVar32;
      unaff_RBP = (ulong)uVar42;
      if (uVar42 != 0) {
        *puVar30 = uVar38;
        puVar30 = puVar30 + 1;
        lVar34 = 0;
        if (unaff_RBP != 0) {
          for (; (uVar42 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
          }
        }
        uVar38 = *(ulong *)(uVar33 + lVar34 * 8);
        uVar42 = uVar42 - 1 & uVar42;
        uVar35 = (ulong)uVar42;
        if (uVar42 != 0) {
          do {
            *puVar30 = uVar38;
            puVar30 = puVar30 + 1;
            lVar34 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
              }
            }
            unaff_RBP = uVar35 - 1;
            uVar38 = *(ulong *)(uVar33 + lVar34 * 8);
            uVar35 = uVar35 & unaff_RBP;
          } while (uVar35 != 0);
        }
      }
    }
    uVar33 = (ulong)((uint)uVar38 & 0xf);
    if (uVar33 != 8) {
      uVar38 = uVar38 & 0xfffffffffffffff0;
      fVar41 = *(float *)(ray + k * 4);
      fVar44 = *(float *)(ray + k * 4 + 0x10);
      fVar47 = *(float *)(ray + k * 4 + 0x20);
      fVar50 = *(float *)(ray + k * 4 + 0x40);
      fVar53 = *(float *)(ray + k * 4 + 0x50);
      fVar57 = *(float *)(ray + k * 4 + 0x60);
      unaff_RBP = 0;
      do {
        lVar34 = unaff_RBP * 0xb0;
        pfVar1 = (float *)(uVar38 + 0x80 + lVar34);
        fVar61 = *pfVar1;
        fVar65 = pfVar1[1];
        fVar80 = pfVar1[2];
        fVar82 = pfVar1[3];
        pfVar1 = (float *)(uVar38 + 0x40 + lVar34);
        fVar105 = *pfVar1;
        fVar108 = pfVar1[1];
        fVar111 = pfVar1[2];
        fVar114 = pfVar1[3];
        pfVar1 = (float *)(uVar38 + 0x70 + lVar34);
        fVar96 = *pfVar1;
        fVar98 = pfVar1[1];
        fVar100 = pfVar1[2];
        fVar102 = pfVar1[3];
        pfVar1 = (float *)(uVar38 + 0x50 + lVar34);
        fVar18 = *pfVar1;
        fVar19 = pfVar1[1];
        fVar20 = pfVar1[2];
        fVar21 = pfVar1[3];
        fVar83 = fVar96 * fVar18 - fVar61 * fVar105;
        fVar86 = fVar98 * fVar19 - fVar65 * fVar108;
        fVar89 = fVar100 * fVar20 - fVar80 * fVar111;
        fVar92 = fVar102 * fVar21 - fVar82 * fVar114;
        pfVar1 = (float *)(uVar38 + 0x60 + lVar34);
        fVar22 = *pfVar1;
        fVar23 = pfVar1[1];
        fVar24 = pfVar1[2];
        fVar25 = pfVar1[3];
        pfVar1 = (float *)(uVar38 + lVar34);
        fVar56 = *pfVar1 - fVar41;
        fVar60 = pfVar1[1] - fVar41;
        fVar64 = pfVar1[2] - fVar41;
        fVar68 = pfVar1[3] - fVar41;
        pfVar1 = (float *)(uVar38 + 0x10 + lVar34);
        fVar43 = *pfVar1 - fVar44;
        fVar46 = pfVar1[1] - fVar44;
        fVar49 = pfVar1[2] - fVar44;
        fVar52 = pfVar1[3] - fVar44;
        fVar77 = fVar53 * fVar56 - fVar50 * fVar43;
        fVar78 = fVar53 * fVar60 - fVar50 * fVar46;
        fVar79 = fVar53 * fVar64 - fVar50 * fVar49;
        fVar81 = fVar53 * fVar68 - fVar50 * fVar52;
        pfVar1 = (float *)(uVar38 + 0x20 + lVar34);
        fVar95 = *pfVar1 - fVar47;
        fVar97 = pfVar1[1] - fVar47;
        fVar99 = pfVar1[2] - fVar47;
        fVar101 = pfVar1[3] - fVar47;
        pfVar1 = (float *)(uVar38 + 0x30 + lVar34);
        fVar26 = *pfVar1;
        fVar27 = pfVar1[1];
        fVar28 = pfVar1[2];
        fVar29 = pfVar1[3];
        fVar103 = fVar61 * fVar26 - fVar18 * fVar22;
        fVar106 = fVar65 * fVar27 - fVar19 * fVar23;
        fVar109 = fVar80 * fVar28 - fVar20 * fVar24;
        fVar112 = fVar82 * fVar29 - fVar21 * fVar25;
        fVar73 = fVar50 * fVar95 - fVar56 * fVar57;
        fVar74 = fVar50 * fVar97 - fVar60 * fVar57;
        fVar75 = fVar50 * fVar99 - fVar64 * fVar57;
        fVar76 = fVar50 * fVar101 - fVar68 * fVar57;
        fVar84 = fVar105 * fVar22 - fVar96 * fVar26;
        fVar87 = fVar108 * fVar23 - fVar98 * fVar27;
        fVar90 = fVar111 * fVar24 - fVar100 * fVar28;
        fVar93 = fVar114 * fVar25 - fVar102 * fVar29;
        fVar104 = fVar57 * fVar43 - fVar53 * fVar95;
        fVar107 = fVar57 * fVar46 - fVar53 * fVar97;
        fVar110 = fVar57 * fVar49 - fVar53 * fVar99;
        fVar113 = fVar57 * fVar52 - fVar53 * fVar101;
        fVar85 = fVar83 * fVar50 + fVar103 * fVar53 + fVar84 * fVar57;
        fVar88 = fVar86 * fVar50 + fVar106 * fVar53 + fVar87 * fVar57;
        fVar91 = fVar89 * fVar50 + fVar109 * fVar53 + fVar90 * fVar57;
        fVar94 = fVar92 * fVar50 + fVar112 * fVar53 + fVar93 * fVar57;
        uVar45 = (uint)fVar85 & 0x80000000;
        uVar48 = (uint)fVar88 & 0x80000000;
        uVar51 = (uint)fVar91 & 0x80000000;
        uVar54 = (uint)fVar94 & 0x80000000;
        fVar96 = (float)((uint)(fVar22 * fVar104 + fVar96 * fVar73 + fVar61 * fVar77) ^ uVar45);
        fVar98 = (float)((uint)(fVar23 * fVar107 + fVar98 * fVar74 + fVar65 * fVar78) ^ uVar48);
        fVar100 = (float)((uint)(fVar24 * fVar110 + fVar100 * fVar75 + fVar80 * fVar79) ^ uVar51);
        fVar102 = (float)((uint)(fVar25 * fVar113 + fVar102 * fVar76 + fVar82 * fVar81) ^ uVar54);
        fVar105 = (float)((uint)(fVar104 * fVar26 + fVar73 * fVar105 + fVar77 * fVar18) ^ uVar45);
        fVar108 = (float)((uint)(fVar107 * fVar27 + fVar74 * fVar108 + fVar78 * fVar19) ^ uVar48);
        fVar111 = (float)((uint)(fVar110 * fVar28 + fVar75 * fVar111 + fVar79 * fVar20) ^ uVar51);
        fVar114 = (float)((uint)(fVar113 * fVar29 + fVar76 * fVar114 + fVar81 * fVar21) ^ uVar54);
        fVar61 = ABS(fVar85);
        fVar65 = ABS(fVar88);
        fVar80 = ABS(fVar91);
        fVar82 = ABS(fVar94);
        bVar14 = ((0.0 <= fVar105 && 0.0 <= fVar96) && fVar85 != 0.0) && fVar96 + fVar105 <= fVar61;
        bVar15 = ((0.0 <= fVar108 && 0.0 <= fVar98) && fVar88 != 0.0) && fVar98 + fVar108 <= fVar65;
        bVar16 = ((0.0 <= fVar111 && 0.0 <= fVar100) && fVar91 != 0.0) &&
                 fVar100 + fVar111 <= fVar80;
        bVar17 = ((0.0 <= fVar114 && 0.0 <= fVar102) && fVar94 != 0.0) &&
                 fVar102 + fVar114 <= fVar82;
        auVar13._4_4_ = -(uint)bVar15;
        auVar13._0_4_ = -(uint)bVar14;
        auVar13._8_4_ = -(uint)bVar16;
        auVar13._12_4_ = -(uint)bVar17;
        uVar42 = movmskps((int)psVar39,auVar13);
        psVar39 = (size_t *)(ulong)uVar42;
        if (uVar42 != 0) {
          fVar111 = (float)(uVar45 ^ (uint)(fVar83 * fVar56 + fVar103 * fVar43 + fVar84 * fVar95));
          fVar114 = (float)(uVar48 ^ (uint)(fVar86 * fVar60 + fVar106 * fVar46 + fVar87 * fVar97));
          fVar96 = (float)(uVar51 ^ (uint)(fVar89 * fVar64 + fVar109 * fVar49 + fVar90 * fVar99));
          fVar98 = (float)(uVar54 ^ (uint)(fVar92 * fVar68 + fVar112 * fVar52 + fVar93 * fVar101));
          fVar105 = *(float *)(ray + k * 4 + 0x30);
          fVar108 = *(float *)(ray + k * 4 + 0x80);
          auVar12._4_4_ =
               -(uint)((fVar114 <= fVar108 * fVar65 && fVar105 * fVar65 < fVar114) && bVar15);
          auVar12._0_4_ =
               -(uint)((fVar111 <= fVar108 * fVar61 && fVar105 * fVar61 < fVar111) && bVar14);
          auVar12._8_4_ =
               -(uint)((fVar96 <= fVar108 * fVar80 && fVar105 * fVar80 < fVar96) && bVar16);
          auVar12._12_4_ =
               -(uint)((fVar98 <= fVar108 * fVar82 && fVar105 * fVar82 < fVar98) && bVar17);
          uVar42 = movmskps(uVar42,auVar12);
          psVar39 = (size_t *)(ulong)uVar42;
          if (uVar42 != 0) {
            local_8e8 = (byte)uVar42;
            uVar35 = (ulong)local_8e8;
            do {
              uVar10 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              if ((((context->scene->geometries).items
                    [*(uint *)(lVar34 + uVar38 + 0x90 + uVar10 * 4)].ptr)->mask &
                  *(uint *)(ray + k * 4 + 0x90)) != 0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar40;
              }
              uVar35 = uVar35 ^ 1L << (uVar10 & 0x3f);
            } while (uVar35 != 0);
            psVar39 = (size_t *)0x0;
          }
        }
        unaff_RBP = unaff_RBP + 1;
      } while (unaff_RBP != uVar33 - 8);
    }
LAB_0024f556:
    bVar40 = puVar30 != &local_7d8;
    if (!bVar40) {
      return bVar40;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }